

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.h
# Opt level: O2

void __thiscall
CTestResource::SetTileFlag_Custom
          (CTestResource *this,GMM_RESCREATE_CUSTOM_PARAMS *Params,TEST_TILE_TYPE Tile)

{
  undefined1 *puVar1;
  anon_struct_8_44_94931171_for_Info aVar2;
  
  switch(Tile) {
  case TEST_LINEAR:
    puVar1 = &(Params->Flags).Info.field_0x2;
    *puVar1 = *puVar1 | 8;
    break;
  case TEST_TILEX:
    puVar1 = &(Params->Flags).Info.field_0x4;
    *puVar1 = *puVar1 | 8;
    break;
  case TEST_TILEY:
    aVar2 = (Params->Flags).Info;
    if (((uint)(CommonULT::pGfxAdapterInfo->SkuTable).field_0 & 0x40) == 0) {
      aVar2 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar2 | 0x80000000000);
    }
    else {
      aVar2 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar2 | 0x1000000000);
    }
    goto LAB_0012179f;
  case TEST_TILEYS:
    aVar2 = (Params->Flags).Info;
    if (((uint)(CommonULT::pGfxAdapterInfo->SkuTable).field_0 & 0x40) == 0) {
      aVar2 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar2 | 0x100000000000);
    }
    else {
      aVar2 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar2 | 0x5000000000);
    }
LAB_0012179f:
    (Params->Flags).Info = aVar2;
    break;
  case TEST_TILEYF:
    puVar1 = &(Params->Flags).Info.field_0x4;
    *puVar1 = *puVar1 | 0x30;
  }
  return;
}

Assistant:

void SetTileFlag_Custom(GMM_RESCREATE_CUSTOM_PARAMS& Params, TEST_TILE_TYPE Tile)
    {
        switch (Tile)
        {
        case TEST_LINEAR:
            Params.Flags.Info.Linear = 1;
            break;
        case TEST_TILEX:
            Params.Flags.Info.TiledX = 1;
            break;
        case TEST_TILEY:
            if (pGfxAdapterInfo->SkuTable.FtrTileY)
            {
                Params.Flags.Info.TiledY = 1;
            }
            else
            {
                Params.Flags.Info.Tile4 = 1;
            }
            break;
        case TEST_TILEYF:
            Params.Flags.Info.TiledY = 1;
            Params.Flags.Info.TiledYf = 1;
            break;
        case TEST_TILEYS:
            if (pGfxAdapterInfo->SkuTable.FtrTileY)
            {
                Params.Flags.Info.TiledY  = 1;
                Params.Flags.Info.TiledYs = 1;
            }
            else
            {
                Params.Flags.Info.Tile64 = 1;
            }
            break;
        default:
            break;
        }
    }